

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BOV.c
# Opt level: O2

bov_text_t * bov_text_new(GLubyte *string,GLenum usage)

{
  GLsizei GVar1;
  bov_text_t *pbVar2;
  size_t sVar3;
  GLfloat *data;
  undefined8 uVar4;
  int len;
  long lVar5;
  
  pbVar2 = (bov_text_t *)malloc(0x60);
  if (pbVar2 == (bov_text_t *)0x0) {
    bov_error_log(0x30001,"Memory allocation failed");
    uVar4 = 0x472;
LAB_00106ce4:
    fprintf(_stderr,"\t(in function %s, line %d)\n","bov_text_new",uVar4);
    exit(1);
  }
  (pbVar2->param).fillColor[0] = 0.0;
  (pbVar2->param).fillColor[1] = 0.0;
  (pbVar2->param).fillColor[2] = 0.0;
  (pbVar2->param).fillColor[3] = 1.0;
  (pbVar2->param).outlineColor[0] = 1.0;
  (pbVar2->param).outlineColor[1] = 1.0;
  (pbVar2->param).outlineColor[2] = 1.0;
  (pbVar2->param).outlineColor[3] = 2.0;
  (pbVar2->param).pos[0] = 0.0;
  (pbVar2->param).pos[1] = 0.0;
  (pbVar2->param).shift[0] = 0.0;
  (pbVar2->param).shift[1] = 0.0;
  (pbVar2->param).fontSize = 0.05;
  (pbVar2->param).boldness = 0.0;
  (pbVar2->param).outlineWidth = -1.0;
  (pbVar2->param).spaceType = USUAL_SPACE;
  (*glad_glGenVertexArrays)(1,(GLuint *)pbVar2);
  (*glad_glBindVertexArray)(pbVar2->vao);
  (*glad_glGenBuffers)(1,&pbVar2->vbo);
  (*glad_glBindBuffer)(0x8892,pbVar2->vbo);
  GVar1 = 0;
  (*glad_glVertexAttribPointer)(0,2,0x1406,'\0',0x10,(void *)0x0);
  lVar5 = 8;
  (*glad_glVertexAttribPointer)(1,2,0x1406,'\0',0x10,(void *)0x8);
  (*glad_glEnableVertexAttribArray)(0);
  (*glad_glEnableVertexAttribArray)(1);
  if (string == (GLubyte *)0x0) {
    pbVar2->vboCapacity = 0;
    pbVar2->vboLen = 0;
    pbVar2->data = (GLfloat *)0x0;
    lVar5 = 0x10;
  }
  else {
    sVar3 = strlen((char *)string);
    len = (int)sVar3;
    pbVar2->dataCapacity = len;
    data = (GLfloat *)malloc((long)len * 0x60);
    pbVar2->data = data;
    if (data == (GLfloat *)0x0) {
      bov_error_log(0x30001,"Memory allocation failed");
      uVar4 = 0x49f;
      goto LAB_00106ce4;
    }
    GVar1 = fill_text_data(data,string,len);
    pbVar2->vboLen = GVar1;
    (*glad_glBufferData)(0x8892,(long)GVar1 * 0x60,data,usage);
    GVar1 = pbVar2->vboLen;
  }
  *(GLsizei *)((long)(pbVar2->param).fillColor + lVar5 + -0x20) = GVar1;
  return pbVar2;
}

Assistant:

bov_text_t* bov_text_new(const GLubyte* string, GLenum usage)
{
	bov_text_t* text = malloc(sizeof(bov_text_t));
	CHECK_MALLOC(text);

	text->param = (bov_text_param_t) {
		.fillColor = {0.0f, 0.0f, 0.0f, 1.0f},
		.outlineColor = {1.0f ,1.0f, 1.0f, 2.0f},
		.pos = {0.0f, 0.0f},
		.shift = {0.0f, 0.0f},
		.fontSize = 0.05f,
		.boldness = 0.0f,
		.outlineWidth = -1.0f,
		.spaceType = USUAL_SPACE};

	// Create Vertex Array Object
	glGenVertexArrays(1, &text->vao);
	glBindVertexArray(text->vao);

	// Vertex Buffer Object
	glGenBuffers(1, &text->vbo);
	glBindBuffer(GL_ARRAY_BUFFER, text->vbo);

	// specify the layout of the data
	glVertexAttribPointer(POS_LOCATION,
	                      2,
	                      GL_FLOAT,
	                      GL_FALSE,
	                      4 * sizeof(GLfloat),
	                      0);
	glVertexAttribPointer(TEX_LOCATION,
	                      2,
	                      GL_FLOAT,
	                      GL_FALSE,
	                      4 * sizeof(GLfloat),
	                      (void*)(2 * sizeof(GLfloat)));
	glEnableVertexAttribArray(POS_LOCATION);
	glEnableVertexAttribArray(TEX_LOCATION);

	if(string!=NULL) {
		text->dataCapacity = (GLsizei) strlen((const char *)string);

		// data for text contain... 4 vertex per letter
		// for each letter, we must have
		// 2 screen coordinates      4f
		// 2 texture coordinates     4f

		text->data = malloc(sizeof(GLfloat) * 24 * text->dataCapacity);
		CHECK_MALLOC(text->data);

		// text->string = string;

		text->vboLen = fill_text_data(text->data,
		                              string,
		                              text->dataCapacity);
		glBufferData(GL_ARRAY_BUFFER,
		             sizeof(GLfloat) * 24 * text->vboLen,
		             text->data,
		             usage);
		text->vboCapacity = text->vboLen;
	}
	else {
		text->vboLen = 0;
		text->vboCapacity = 0;
		text->data = NULL;
		text->dataCapacity = 0;
	}

	// glBindBuffer(GL_ARRAY_BUFFER, 0);
	// glBindVertexArray(0);

	return text;
}